

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

void __thiscall
helics::InterfaceInfo::createInput
          (InterfaceInfo *this,InterfaceHandle handle,string_view key,string_view type,
          string_view units,uint16_t flags)

{
  InputInfo *this_00;
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle> *this_01;
  char *pcVar1;
  handle ciHandle;
  InterfaceHandle local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle> *local_70;
  unique_lock<std::shared_mutex> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  GlobalHandle local_38;
  
  local_58._M_str = type._M_str;
  local_58._M_len = type._M_len;
  pcVar1 = key._M_str;
  local_70 = (DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>
              *)&this->inputs;
  local_68._M_device = &(this->inputs).m_mutex;
  local_68._M_owns = false;
  local_94.hid = handle.hid;
  local_48._M_len = key._M_len;
  local_48._M_str = pcVar1;
  std::unique_lock<std::shared_mutex>::lock(&local_68);
  this_01 = local_70;
  local_68._M_owns = true;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar1,pcVar1 + key._M_len);
  local_38.fed_id.gid = (this->global_id)._M_i.gid;
  local_38.handle.hid = local_94.hid;
  gmlc::containers::
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (this_01,&local_90,&local_94,&local_38,&local_48,&local_58,&units);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  this_00 = *(InputInfo **)(*(long *)(local_70 + 8) + -8);
  this_00->only_update_on_change = this->only_update_on_change;
  if ((flags & 4) != 0) {
    InputInfo::setProperty(this_00,0x18d,1);
  }
  if ((flags >> 8 & 1) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_70 + 8) + -8),0x192,1);
  }
  if ((flags & 0x40) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_70 + 8) + -8),0x1c6,1);
  }
  if ((flags & 8) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_70 + 8) + -8),0x197,1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_68);
  return;
}

Assistant:

void InterfaceInfo::createInput(InterfaceHandle handle,
                                std::string_view key,
                                std::string_view type,
                                std::string_view units,
                                std::uint16_t flags)
{
    auto ciHandle = inputs.lock();
    ciHandle->insert(std::string(key), handle, GlobalHandle{global_id, handle}, key, type, units);
    ciHandle->back()->only_update_on_change = only_update_on_change;

    if (checkActionFlag(flags, required_flag)) {
        ciHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        ciHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, only_update_on_change_flag)) {
        ciHandle->back()->setProperty(defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE, 1);
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        ciHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
}